

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrb.h
# Opt level: O0

ref<immutable::rrb_details::tree_node<int,_false>_> __thiscall
immutable::rrb_details::rrb_drop_left_rec<int,false,6>
          (rrb_details *this,uint32_t *total_shift,
          ref<immutable::rrb_details::tree_node<int,_false>_> *root,uint32_t left,uint32_t shift,
          bool has_right)

{
  uint32_t uVar1;
  uint32_t *puVar2;
  ref<immutable::rrb_details::internal_node<int,_false>_> *prVar3;
  int iVar4;
  internal_node<int,_false> *piVar5;
  rrb_size_table<false> *prVar6;
  leaf_node<int,_false> *plVar7;
  byte bVar8;
  uint local_dc;
  uint32_t i_3;
  ref<immutable::rrb_details::leaf_node<int,_false>_> right_vals;
  uint32_t right_vals_len;
  ref<immutable::rrb_details::leaf_node<int,_false>_> leaf_root;
  uint32_t i_2;
  uint32_t i_1;
  ref<immutable::rrb_details::rrb_size_table<false>_> sliced_table_1;
  ref<immutable::rrb_details::rrb_size_table<false>_> table_1;
  uint32_t i;
  ref<immutable::rrb_details::internal_node<int,_false>_> sliced_root;
  uint32_t sliced_len;
  ref<immutable::rrb_details::rrb_size_table<false>_> sliced_table;
  ref<immutable::rrb_details::internal_node<int,_false>_> internal_left_hand_node;
  ref<immutable::rrb_details::internal_node<int,_false>_> left_hand_parent;
  ref<immutable::rrb_details::tree_node<int,_false>_> left_hand_node;
  ref<immutable::rrb_details::tree_node<int,_false>_> local_60;
  ref<immutable::rrb_details::tree_node<int,_false>_> child;
  uint32_t last_slot;
  rrb_size_table<false> *table;
  uint32_t idx;
  ref<immutable::rrb_details::internal_node<int,_false>_> internal_root;
  uint32_t subidx;
  uint32_t subshift;
  bool has_right_local;
  uint32_t shift_local;
  uint32_t left_local;
  ref<immutable::rrb_details::tree_node<int,_false>_> *root_local;
  uint32_t *total_shift_local;
  
  bVar8 = (byte)shift;
  internal_root.ptr._4_4_ = left >> (bVar8 & 0x1f);
  if (shift == 0) {
    ref<immutable::rrb_details::leaf_node<int,false>>::
    ref<immutable::rrb_details::tree_node<int,false>>
              ((ref<immutable::rrb_details::leaf_node<int,false>> *)&stack0xffffffffffffff38,root);
    plVar7 = ref<immutable::rrb_details::leaf_node<int,_false>_>::operator->
                       ((ref<immutable::rrb_details::leaf_node<int,_false>_> *)
                        &stack0xffffffffffffff38);
    right_vals.ptr._4_4_ = plVar7->len - internal_root.ptr._4_4_;
    plVar7 = leaf_node_create<int,false>(right_vals.ptr._4_4_);
    ref<immutable::rrb_details::leaf_node<int,_false>_>::ref
              ((ref<immutable::rrb_details::leaf_node<int,_false>_> *)&stack0xffffffffffffff28,
               plVar7);
    for (local_dc = 0; local_dc < right_vals.ptr._4_4_; local_dc = local_dc + 1) {
      plVar7 = ref<immutable::rrb_details::leaf_node<int,_false>_>::operator->
                         ((ref<immutable::rrb_details::leaf_node<int,_false>_> *)
                          &stack0xffffffffffffff38);
      iVar4 = plVar7->child[internal_root.ptr._4_4_ + local_dc];
      plVar7 = ref<immutable::rrb_details::leaf_node<int,_false>_>::operator->
                         ((ref<immutable::rrb_details::leaf_node<int,_false>_> *)
                          &stack0xffffffffffffff28);
      plVar7->child[local_dc] = iVar4;
    }
    *total_shift = 0;
    ref<immutable::rrb_details::tree_node<int,false>>::
    ref<immutable::rrb_details::leaf_node<int,false>>
              ((ref<immutable::rrb_details::tree_node<int,false>> *)this,
               (ref<immutable::rrb_details::leaf_node<int,_false>_> *)&stack0xffffffffffffff28);
    sliced_root.ptr._4_4_ = 1;
    ref<immutable::rrb_details::leaf_node<int,_false>_>::~ref
              ((ref<immutable::rrb_details::leaf_node<int,_false>_> *)&stack0xffffffffffffff28);
    ref<immutable::rrb_details::leaf_node<int,_false>_>::~ref
              ((ref<immutable::rrb_details::leaf_node<int,_false>_> *)&stack0xffffffffffffff38);
  }
  else {
    ref<immutable::rrb_details::internal_node<int,false>>::
    ref<immutable::rrb_details::tree_node<int,false>>
              ((ref<immutable::rrb_details::internal_node<int,false>> *)&stack0xffffffffffffffc0,
               root);
    piVar5 = ref<immutable::rrb_details::internal_node<int,_false>_>::operator->
                       ((ref<immutable::rrb_details::internal_node<int,_false>_> *)
                        &stack0xffffffffffffffc0);
    if ((piVar5->size_table).ptr == (rrb_size_table<false> *)0x0) {
      table._4_4_ = left - (internal_root.ptr._4_4_ << (bVar8 & 0x1f));
    }
    else {
      piVar5 = ref<immutable::rrb_details::internal_node<int,_false>_>::operator->
                         ((ref<immutable::rrb_details::internal_node<int,_false>_> *)
                          &stack0xffffffffffffffc0);
      prVar6 = (piVar5->size_table).ptr;
      for (; prVar6->size[internal_root.ptr._4_4_] <= left;
          internal_root.ptr._4_4_ = internal_root.ptr._4_4_ + 1) {
      }
      table._4_4_ = left;
      if (internal_root.ptr._4_4_ != 0) {
        table._4_4_ = left - prVar6->size[internal_root.ptr._4_4_ - 1];
      }
    }
    piVar5 = ref<immutable::rrb_details::internal_node<int,_false>_>::operator->
                       ((ref<immutable::rrb_details::internal_node<int,_false>_> *)
                        &stack0xffffffffffffffc0);
    child.ptr._4_4_ = piVar5->len - 1;
    piVar5 = ref<immutable::rrb_details::internal_node<int,_false>_>::operator->
                       ((ref<immutable::rrb_details::internal_node<int,_false>_> *)
                        &stack0xffffffffffffffc0);
    ref<immutable::rrb_details::tree_node<int,false>>::
    ref<immutable::rrb_details::internal_node<int,false>>
              ((ref<immutable::rrb_details::tree_node<int,false>> *)&local_60,
               piVar5->child + internal_root.ptr._4_4_);
    rrb_drop_left_rec<int,false,6>
              ((rrb_details *)&left_hand_parent,total_shift,&local_60,table._4_4_,shift - 6,
               internal_root.ptr._4_4_ != child.ptr._4_4_ || has_right);
    if (internal_root.ptr._4_4_ == child.ptr._4_4_) {
      if (has_right) {
        piVar5 = internal_node_create<int,false>(1);
        ref<immutable::rrb_details::internal_node<int,_false>_>::ref
                  (&internal_left_hand_node,piVar5);
        ref<immutable::rrb_details::internal_node<int,false>>::
        ref<immutable::rrb_details::tree_node<int,false>>
                  ((ref<immutable::rrb_details::internal_node<int,false>> *)&sliced_table,
                   (ref<immutable::rrb_details::tree_node<int,_false>_> *)&left_hand_parent);
        piVar5 = ref<immutable::rrb_details::internal_node<int,_false>_>::operator->
                           (&internal_left_hand_node);
        ref<immutable::rrb_details::internal_node<int,_false>_>::operator=
                  (piVar5->child,
                   (ref<immutable::rrb_details::internal_node<int,_false>_> *)&sliced_table);
        if ((shift - 6 != 0) &&
           (piVar5 = ref<immutable::rrb_details::internal_node<int,_false>_>::operator->
                               ((ref<immutable::rrb_details::internal_node<int,_false>_> *)
                                &sliced_table),
           (piVar5->size_table).ptr != (rrb_size_table<false> *)0x0)) {
          prVar6 = size_table_create<false>(1);
          ref<immutable::rrb_details::rrb_size_table<false>_>::ref
                    ((ref<immutable::rrb_details::rrb_size_table<false>_> *)&sliced_len,prVar6);
          piVar5 = ref<immutable::rrb_details::internal_node<int,_false>_>::operator->
                             ((ref<immutable::rrb_details::internal_node<int,_false>_> *)
                              &sliced_table);
          prVar6 = ref<immutable::rrb_details::rrb_size_table<false>_>::operator->
                             (&piVar5->size_table);
          puVar2 = prVar6->size;
          piVar5 = ref<immutable::rrb_details::internal_node<int,_false>_>::operator->
                             ((ref<immutable::rrb_details::internal_node<int,_false>_> *)
                              &sliced_table);
          uVar1 = puVar2[piVar5->len - 1];
          prVar6 = ref<immutable::rrb_details::rrb_size_table<false>_>::operator->
                             ((ref<immutable::rrb_details::rrb_size_table<false>_> *)&sliced_len);
          *prVar6->size = uVar1;
          piVar5 = ref<immutable::rrb_details::internal_node<int,_false>_>::operator->
                             (&internal_left_hand_node);
          ref<immutable::rrb_details::rrb_size_table<false>_>::operator=
                    (&piVar5->size_table,
                     (ref<immutable::rrb_details::rrb_size_table<false>_> *)&sliced_len);
          ref<immutable::rrb_details::rrb_size_table<false>_>::~ref
                    ((ref<immutable::rrb_details::rrb_size_table<false>_> *)&sliced_len);
        }
        *total_shift = shift;
        ref<immutable::rrb_details::tree_node<int,false>>::
        ref<immutable::rrb_details::internal_node<int,false>>
                  ((ref<immutable::rrb_details::tree_node<int,false>> *)this,
                   &internal_left_hand_node);
        sliced_root.ptr._4_4_ = 1;
        ref<immutable::rrb_details::internal_node<int,_false>_>::~ref
                  ((ref<immutable::rrb_details::internal_node<int,_false>_> *)&sliced_table);
        ref<immutable::rrb_details::internal_node<int,_false>_>::~ref(&internal_left_hand_node);
      }
      else {
        ref<immutable::rrb_details::tree_node<int,_false>_>::ref
                  ((ref<immutable::rrb_details::tree_node<int,_false>_> *)this,
                   (ref<immutable::rrb_details::tree_node<int,_false>_> *)&left_hand_parent);
        sliced_root.ptr._4_4_ = 1;
      }
    }
    else {
      piVar5 = ref<immutable::rrb_details::internal_node<int,_false>_>::operator->
                         ((ref<immutable::rrb_details::internal_node<int,_false>_> *)
                          &stack0xffffffffffffffc0);
      sliced_root.ptr._0_4_ = piVar5->len - internal_root.ptr._4_4_;
      piVar5 = internal_node_create<int,false>((uint32_t)sliced_root.ptr);
      ref<immutable::rrb_details::internal_node<int,_false>_>::ref
                ((ref<immutable::rrb_details::internal_node<int,_false>_> *)&stack0xffffffffffffff60
                 ,piVar5);
      for (table_1.ptr._4_4_ = 0; table_1.ptr._4_4_ < (uint32_t)sliced_root.ptr - 1;
          table_1.ptr._4_4_ = table_1.ptr._4_4_ + 1) {
        piVar5 = ref<immutable::rrb_details::internal_node<int,_false>_>::operator->
                           ((ref<immutable::rrb_details::internal_node<int,_false>_> *)
                            &stack0xffffffffffffffc0);
        prVar3 = piVar5->child;
        iVar4 = internal_root.ptr._4_4_ + 1;
        piVar5 = ref<immutable::rrb_details::internal_node<int,_false>_>::operator->
                           ((ref<immutable::rrb_details::internal_node<int,_false>_> *)
                            &stack0xffffffffffffff60);
        ref<immutable::rrb_details::internal_node<int,_false>_>::operator=
                  (piVar5->child + (table_1.ptr._4_4_ + 1),prVar3 + (iVar4 + table_1.ptr._4_4_));
      }
      piVar5 = ref<immutable::rrb_details::internal_node<int,_false>_>::operator->
                         ((ref<immutable::rrb_details::internal_node<int,_false>_> *)
                          &stack0xffffffffffffffc0);
      ref<immutable::rrb_details::rrb_size_table<false>_>::ref(&sliced_table_1,&piVar5->size_table);
      prVar6 = size_table_create<false>((uint32_t)sliced_root.ptr);
      ref<immutable::rrb_details::rrb_size_table<false>_>::ref
                ((ref<immutable::rrb_details::rrb_size_table<false>_> *)&i_2,prVar6);
      if (sliced_table_1.ptr == (rrb_size_table<false> *)0x0) {
        for (leaf_root.ptr._4_4_ = 0; leaf_root.ptr._4_4_ < (uint32_t)sliced_root.ptr;
            leaf_root.ptr._4_4_ = leaf_root.ptr._4_4_ + 1) {
          iVar4 = internal_root.ptr._4_4_ + 1 + leaf_root.ptr._4_4_;
          prVar6 = ref<immutable::rrb_details::rrb_size_table<false>_>::operator->
                             ((ref<immutable::rrb_details::rrb_size_table<false>_> *)&i_2);
          prVar6->size[leaf_root.ptr._4_4_] = iVar4 << (bVar8 & 0x1f);
        }
      }
      else {
        prVar6 = ref<immutable::rrb_details::rrb_size_table<false>_>::operator->
                           ((ref<immutable::rrb_details::rrb_size_table<false>_> *)&i_2);
        puVar2 = prVar6->size;
        prVar6 = ref<immutable::rrb_details::rrb_size_table<false>_>::operator->(&sliced_table_1);
        memcpy(puVar2,prVar6->size + internal_root.ptr._4_4_,(ulong)(uint32_t)sliced_root.ptr << 2);
      }
      for (leaf_root.ptr._0_4_ = 0; (uint)leaf_root.ptr < (uint32_t)sliced_root.ptr;
          leaf_root.ptr._0_4_ = (uint)leaf_root.ptr + 1) {
        prVar6 = ref<immutable::rrb_details::rrb_size_table<false>_>::operator->
                           ((ref<immutable::rrb_details::rrb_size_table<false>_> *)&i_2);
        prVar6->size[(uint)leaf_root.ptr] = prVar6->size[(uint)leaf_root.ptr] - left;
      }
      piVar5 = ref<immutable::rrb_details::internal_node<int,_false>_>::operator->
                         ((ref<immutable::rrb_details::internal_node<int,_false>_> *)
                          &stack0xffffffffffffff60);
      ref<immutable::rrb_details::rrb_size_table<false>_>::operator=
                (&piVar5->size_table,(ref<immutable::rrb_details::rrb_size_table<false>_> *)&i_2);
      piVar5 = ref<immutable::rrb_details::internal_node<int,_false>_>::operator->
                         ((ref<immutable::rrb_details::internal_node<int,_false>_> *)
                          &stack0xffffffffffffff60);
      ref<immutable::rrb_details::internal_node<int,false>>::operator=
                ((ref<immutable::rrb_details::internal_node<int,false>> *)piVar5->child,
                 (ref<immutable::rrb_details::tree_node<int,_false>_> *)&left_hand_parent);
      *total_shift = shift;
      ref<immutable::rrb_details::tree_node<int,false>>::
      ref<immutable::rrb_details::internal_node<int,false>>
                ((ref<immutable::rrb_details::tree_node<int,false>> *)this,
                 (ref<immutable::rrb_details::internal_node<int,_false>_> *)&stack0xffffffffffffff60
                );
      sliced_root.ptr._4_4_ = 1;
      ref<immutable::rrb_details::rrb_size_table<false>_>::~ref
                ((ref<immutable::rrb_details::rrb_size_table<false>_> *)&i_2);
      ref<immutable::rrb_details::rrb_size_table<false>_>::~ref(&sliced_table_1);
      ref<immutable::rrb_details::internal_node<int,_false>_>::~ref
                ((ref<immutable::rrb_details::internal_node<int,_false>_> *)&stack0xffffffffffffff60
                );
    }
    ref<immutable::rrb_details::tree_node<int,_false>_>::~ref
              ((ref<immutable::rrb_details::tree_node<int,_false>_> *)&left_hand_parent);
    ref<immutable::rrb_details::tree_node<int,_false>_>::~ref(&local_60);
    ref<immutable::rrb_details::internal_node<int,_false>_>::~ref
              ((ref<immutable::rrb_details::internal_node<int,_false>_> *)&stack0xffffffffffffffc0);
  }
  return (ref<immutable::rrb_details::tree_node<int,_false>_>)(tree_node<int,_false> *)this;
}

Assistant:

inline ref<tree_node<T, atomic_ref_counting>> rrb_drop_left_rec(uint32_t *total_shift, const ref<tree_node<T, atomic_ref_counting>>& root, uint32_t left, uint32_t shift, bool has_right)
      {
      const uint32_t subshift = shift - bits<N>::rrb_bits;
      uint32_t subidx = left >> shift;
      if (shift > 0)
        {
        ref<internal_node<T, atomic_ref_counting>> internal_root = root;
        uint32_t idx = left;
        if (internal_root->size_table.ptr == nullptr)
          {
          idx -= subidx << shift;
          }
        else
          { // if (internal_root->size_table != NULL)
          const rrb_size_table<atomic_ref_counting> *table = internal_root->size_table.ptr;

          while (table->size[subidx] <= idx)
            {
            subidx++;
            }
          if (subidx != 0)
            {
            idx -= table->size[subidx - 1];
            }
          }

        const uint32_t last_slot = internal_root->len - 1;
        ref<tree_node<T, atomic_ref_counting>> child = internal_root->child[subidx];
        ref<tree_node<T, atomic_ref_counting>> left_hand_node = rrb_drop_left_rec<T, atomic_ref_counting, N>(total_shift, child, idx, subshift, (subidx != last_slot) | has_right);
        if (subidx == last_slot)
          { // No more slots left
          if (has_right)
            {
            ref<internal_node<T, atomic_ref_counting>> left_hand_parent = internal_node_create<T, atomic_ref_counting>(1);
            ref<internal_node<T, atomic_ref_counting>> internal_left_hand_node = left_hand_node;
            left_hand_parent->child[0] = internal_left_hand_node;

            if (subshift != 0 && internal_left_hand_node->size_table.ptr != nullptr)
              {
              ref<rrb_size_table<atomic_ref_counting>> sliced_table = size_table_create<atomic_ref_counting>(1);
              sliced_table->size[0] = internal_left_hand_node->size_table->size[internal_left_hand_node->len - 1];
              left_hand_parent->size_table = sliced_table;
              }
            *total_shift = shift;
            return left_hand_parent;
            }
          else
            { // if (!has_right)
            return left_hand_node;
            }
          }
        else
          { // if (subidx != last_slot)

          const uint32_t sliced_len = internal_root->len - subidx;
          ref<internal_node<T, atomic_ref_counting>> sliced_root = internal_node_create<T, atomic_ref_counting>(sliced_len);

          // TODO: Can shrink size here if sliced_len == 2, using the ambidextrous
          // vector technique w. offset. Takes constant time.

          for (uint32_t i = 0; i < (sliced_len - 1); ++i)
            sliced_root->child[1 + i] = internal_root->child[subidx + 1 + i];

          ref<rrb_size_table<atomic_ref_counting>> table = internal_root->size_table; // [JanM] copy seems unnecessary, todo

          // TODO: Can check if left is a power of the tree size. If so, all nodes
          // will be completely populated, and we can ignore the size table. Most
          // importantly, this will remove the need to alloc a size table, which
          // increases perf.
          ref<rrb_size_table<atomic_ref_counting>> sliced_table = size_table_create<atomic_ref_counting>(sliced_len);

          if (table.ptr == nullptr)
            {
            for (uint32_t i = 0; i < sliced_len; i++)
              {
              // left is total amount sliced off. By adding in subidx, we get faster
              // computation later on.
              sliced_table->size[i] = (subidx + 1 + i) << shift;
              // NOTE: This doesn't really work properly for top root, as last node
              // may have a higher count than it *actually* has. To remedy for this,
              // the top function performs a check afterwards, which may insert the
              // correct value if there's a size table in the root.
              }
            }
          else
            { // if (table != NULL)
            memcpy(sliced_table->size, &table->size[subidx], sliced_len * sizeof(uint32_t));
            }

          for (uint32_t i = 0; i < sliced_len; i++)
            {
            sliced_table->size[i] -= left;
            }

          sliced_root->size_table = sliced_table;
          sliced_root->child[0] = left_hand_node;
          *total_shift = shift;
          return sliced_root;
          }
        }
      else
        { // if (shift <= RRB_BRANCHING)
        ref<leaf_node<T, atomic_ref_counting>> leaf_root = root;
        const uint32_t right_vals_len = leaf_root->len - subidx;
        ref<leaf_node<T, atomic_ref_counting>> right_vals = leaf_node_create<T, atomic_ref_counting>(right_vals_len);

        //memcpy(right_vals->child, &leaf_root->child[subidx], right_vals_len * sizeof(T));
        for (uint32_t i = 0; i < right_vals_len; ++i)
          right_vals->child[i] = leaf_root->child[subidx + i]; // don't memcpy, but use copy constructor

        *total_shift = shift;

        return right_vals;
        }
      }